

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_handler.hpp
# Opt level: O0

void asio::detail::
     wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:131:30),_asio::any_io_executor>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  long in_RDI;
  fenced_block b;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_std::error_code>
  handler;
  handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor,_void>
  w;
  ptr p;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor>
  *h;
  undefined4 in_stack_ffffffffffffff48;
  half_t in_stack_ffffffffffffff4c;
  ptr *in_stack_ffffffffffffff50;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_std::error_code>
  *in_stack_ffffffffffffff58;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_std::error_code>
  *in_stack_ffffffffffffff60;
  
  handler_work<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:131:30),_asio::any_io_executor,_void>
  ::handler_work((handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor,_void>
                  *)in_stack_ffffffffffffff50,
                 (handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor,_void>
                  *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:131:30),_std::error_code>
  ::binder1(in_stack_ffffffffffffff60,&in_stack_ffffffffffffff58->handler_,
            (error_code *)in_stack_ffffffffffffff50);
  ptr::reset(in_stack_ffffffffffffff50);
  if (in_RDI != 0) {
    std_fenced_block::std_fenced_block
              ((std_fenced_block *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    handler_work<helics::MessageTimer::updateTimer(int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>)::$_0,asio::any_io_executor,void>
    ::
    complete<asio::detail::binder1<helics::MessageTimer::updateTimer(int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>)::__0,std::error_code>>
              ((handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor,_void>
                *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (type *)in_stack_ffffffffffffff50);
    std_fenced_block::~std_fenced_block((std_fenced_block *)in_stack_ffffffffffffff58);
  }
  binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:131:30),_std::error_code>
  ::~binder1((binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_std::error_code>
              *)0x6967b0);
  handler_work<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:131:30),_asio::any_io_executor,_void>
  ::~handler_work((handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor,_void>
                   *)0x6967ba);
  ptr::~ptr((ptr *)0x6967c4);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    wait_handler* h(static_cast<wait_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };

    ASIO_HANDLER_COMPLETION((*h));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        static_cast<handler_work<Handler, IoExecutor>&&>(
          h->work_));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder1<Handler, asio::error_code>
      handler(h->handler_, h->ec_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }